

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Copy_8_To_8(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
                uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  uchar *local_40;
  uchar *dest;
  uchar *src;
  PaUtilTriangularDitherGenerator *ditherGenerator_local;
  uint count_local;
  int sourceStride_local;
  void *sourceBuffer_local;
  int destinationStride_local;
  void *destinationBuffer_local;
  
  local_40 = (uchar *)destinationBuffer;
  dest = (uchar *)sourceBuffer;
  ditherGenerator_local._0_4_ = count;
  while ((uint)ditherGenerator_local != 0) {
    *local_40 = *dest;
    dest = dest + sourceStride;
    local_40 = local_40 + destinationStride;
    ditherGenerator_local._0_4_ = (uint)ditherGenerator_local - 1;
  }
  return;
}

Assistant:

static void Copy_8_To_8(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;

    (void) ditherGenerator; /* unused parameter */

    while( count-- )
    {
        *dest = *src;

        src += sourceStride;
        dest += destinationStride;
    }
}